

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnCatchExpr
          (ExprVisitorDelegate *this,TryExpr *expr)

{
  int *piVar1;
  WatWriter *pWVar2;
  Info local_48;
  
  pWVar2 = this->writer_;
  piVar1 = &pWVar2->indent_;
  *piVar1 = *piVar1 + -2;
  if (-1 < *piVar1) {
    Opcode::GetInfo(&local_48,(Opcode *)&Opcode::Catch_Opcode);
    WritePuts(pWVar2,local_48.name,Space);
    pWVar2 = this->writer_;
    pWVar2->indent_ = pWVar2->indent_ + 2;
    (pWVar2->label_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].label_type = Catch;
    if (pWVar2->next_char_ == ForceNewline) {
      WriteNextChar(pWVar2);
    }
    pWVar2->next_char_ = ForceNewline;
    return (Result)Ok;
  }
  __assert_fail("indent_ >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wat-writer.cc"
                ,0xe4,"void wabt::(anonymous namespace)::WatWriter::Dedent()");
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnCatchExpr(TryExpr* expr) {
  writer_->Dedent();
  writer_->WritePutsSpace(Opcode::Catch_Opcode.GetName());
  writer_->Indent();
  writer_->label_stack_.back().label_type = LabelType::Catch;
  writer_->WriteNewline(FORCE_NEWLINE);
  return Result::Ok;
}